

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O2

void Commands::Unjail(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  Character *victim;
  undefined4 extraout_var_00;
  mapped_type *this;
  undefined4 extraout_var_01;
  allocator<char> local_a9;
  key_type local_a8;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  iVar2 = (*from->_vptr_Command_Source[4])(from);
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  victim = World::GetCharacter((World *)CONCAT44(extraout_var,iVar2),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (victim != (Character *)0x0) {
    sVar1 = victim->mapid;
    iVar2 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"JailMap",&local_a9);
    this = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(CONCAT44(extraout_var_00,iVar2) + 0x198),&local_a8);
    iVar2 = util::variant::GetInt(this);
    std::__cxx11::string::~string((string *)&local_a8);
    if (iVar2 != sVar1) {
      iVar2 = (*from->_vptr_Command_Source[4])(from);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"command_access_denied",&local_a9);
      I18N::Format<>(&local_88,(I18N *)(CONCAT44(extraout_var_01,iVar2) + 0x490),&local_a8);
      (*from->_vptr_Command_Source[5])(from,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      return;
    }
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:87:30)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:87:30)>
             ::_M_manager;
  do_punishment(from,victim,
                (function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *)&local_68,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

void Unjail(const std::vector<std::string>& arguments, Command_Source* from)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);

	if (victim && victim->mapid != static_cast<int>(from->SourceWorld()->config["JailMap"]))
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
		return;
	}

	do_punishment(from, victim, [](World* world, Command_Source* from, Character* victim, bool announce)
		{
			(void)announce;
			world->Unjail(from, victim);
		}, false);
}